

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::a_formatter<spdlog::details::scoped_padder>::format
          (a_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  reference ppcVar1;
  size_t wrapped_size;
  memory_buf_t *dest_00;
  string_view_t view;
  undefined1 local_70 [8];
  scoped_padder p;
  string_view_t field_value;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  a_formatter<spdlog::details::scoped_padder> *this_local;
  
  ppcVar1 = std::array<const_char_*,_7UL>::operator[]
                      ((array<const_char_*,_7UL> *)details::days,(long)tm_time->tm_wday);
  p.spaces_.size_ = (size_t)*ppcVar1;
  std::char_traits<char>::length((char_type *)p.spaces_.size_);
  wrapped_size = fmt::v10::basic_string_view<char>::size
                           ((basic_string_view<char> *)&p.spaces_.size_);
  dest_00 = dest;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_70,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  view.size_ = (size_t)dest;
  view.data_ = field_value.data_;
  fmt_helper::append_string_view((fmt_helper *)p.spaces_.size_,view,dest_00);
  scoped_padder::~scoped_padder((scoped_padder *)local_70);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        string_view_t field_value{days[static_cast<size_t>(tm_time.tm_wday)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }